

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabelFinder.cpp
# Opt level: O2

void __thiscall Saturation::LabelFinder::onNewPropositionalClause(LabelFinder *this,Clause *cl)

{
  uint elem;
  bool bVar1;
  
  bVar1 = Kernel::MainLoop::isRefutation(cl);
  if (!bVar1) {
    bVar1 = Kernel::Clause::noSplits(cl);
    if (((bVar1) && ((*(uint *)&cl->field_0x38 & 0xffffe) == 0)) &&
       (elem = (cl->_literals[0]->super_Term)._functor,
       (*(byte *)(*(long *)(*(long *)(DAT_00a14190 + 0x80) + (ulong)elem * 8) + 0x40) & 0x20) != 0))
    {
      Lib::Stack<unsigned_int>::push(&this->_foundLabels,elem);
      return;
    }
  }
  return;
}

Assistant:

void LabelFinder::onNewPropositionalClause(Clause* cl)
{
  ASS(cl);
  // if we found a refutation ignore it
  if(Kernel::MainLoop::isRefutation(cl)) return;

  // Currently don't know what to do if conditional
  if(!cl->noSplits()) {
    return;
  }
  // Just looking for unit clauses
  if(cl->size() > 1){
    return;
  }

  unsigned predicate = (*cl)[0]->functor();

  // Looking for predicates
  ASS(env.signature->getPredicate(predicate));
  if(!env.signature->getPredicate(predicate)->label()){
    return;
  }

  _foundLabels.push(predicate);
}